

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeRollback(Btree *p,int tripCode)

{
  int iVar1;
  u32 local_30;
  int local_2c;
  int nPage;
  int rc2;
  MemPage *pPage1;
  BtShared *pBt;
  int rc;
  int tripCode_local;
  Btree *p_local;
  
  pPage1 = (MemPage *)p->pBt;
  pBt._4_4_ = tripCode;
  _rc = p;
  sqlite3BtreeEnter(p);
  if (pBt._4_4_ == 0) {
    pBt._0_4_ = saveAllCursors((BtShared *)pPage1,0,(BtCursor *)0x0);
    pBt._4_4_ = (int)pBt;
  }
  else {
    pBt._0_4_ = 0;
  }
  if (pBt._4_4_ != 0) {
    sqlite3BtreeTripAllCursors(_rc,pBt._4_4_);
  }
  if (_rc->inTrans == '\x02') {
    local_2c = sqlite3PagerRollback(*(Pager **)pPage1);
    if (local_2c != 0) {
      pBt._0_4_ = local_2c;
    }
    iVar1 = btreeGetPage((BtShared *)pPage1,1,(MemPage **)&nPage,0,0);
    if (iVar1 == 0) {
      local_30 = sqlite3Get4byte(_nPage->aData + 0x1c);
      if (local_30 == 0) {
        sqlite3PagerPagecount(*(Pager **)pPage1,(int *)&local_30);
      }
      *(u32 *)((long)pPage1->apOvfl + 0x1c) = local_30;
      releasePage(_nPage);
    }
    *(undefined1 *)((long)pPage1->apOvfl + 4) = 1;
    btreeClearHasContent((BtShared *)pPage1);
  }
  btreeEndTransaction(_rc);
  sqlite3BtreeLeave(_rc);
  return (int)pBt;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    sqlite3BtreeTripAllCursors(p, tripCode);
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0, 0)==SQLITE_OK ){
      int nPage = get4byte(28+(u8*)pPage1->aData);
      testcase( nPage==0 );
      if( nPage==0 ) sqlite3PagerPagecount(pBt->pPager, &nPage);
      testcase( pBt->nPage!=nPage );
      pBt->nPage = nPage;
      releasePage(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}